

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O2

string * __thiscall Component::QuotedName_abi_cxx11_(string *__return_storage_ptr__,Component *this)

{
  allocator local_92;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_50,"\"",&local_91);
  NiceName_abi_cxx11_(&local_70,this,'.');
  std::operator+(&local_30,&local_50,&local_70);
  std::__cxx11::string::string((string *)&local_90,"\"",&local_92);
  std::operator+(__return_storage_ptr__,&local_30,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Component::QuotedName() const {
    return std::string("\"") + NiceName('.') + std::string("\"");
}